

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall
arealights::Application::preloadShaderInclude
          (Application *this,char *filepath,string *glslIncludePath)

{
  PFNGLNAMEDSTRINGARBPROC p_Var1;
  GLint GVar2;
  GLint GVar3;
  GLchar *pGVar4;
  GLchar *pGVar5;
  Writer *this_00;
  Writer local_e8;
  GLenum local_78 [2];
  GLenum err;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string cookTorranceShader;
  string *glslIncludePath_local;
  char *filepath_local;
  Application *this_local;
  
  cookTorranceShader.field_2._8_8_ = glslIncludePath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,filepath,&local_61);
  fw::loadASCIITextFile((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  p_Var1 = glad_glNamedStringARB;
  GVar2 = std::__cxx11::string::size();
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  GVar3 = std::__cxx11::string::size();
  pGVar5 = (GLchar *)std::__cxx11::string::c_str();
  (*p_Var1)(0x8dae,GVar2,pGVar4,GVar3,pGVar5);
  while( true ) {
    local_78[0] = (*glad_glGetError)();
    if (local_78[0] == 0) break;
    el::base::Writer::Writer
              (&local_e8,Error,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
               ,0xd0,
               "void arealights::Application::preloadShaderInclude(const char *, std::string) const"
               ,NormalLog,0);
    this_00 = el::base::Writer::construct(&local_e8,1,"framework");
    el::base::Writer::operator<<(this_00,local_78);
    el::base::Writer::~Writer(&local_e8);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Application::preloadShaderInclude(const char *filepath, std::string glslIncludePath) const
{
    auto cookTorranceShader = fw::loadASCIITextFile(filepath);

    glNamedStringARB(
        GL_SHADER_INCLUDE_ARB,
        glslIncludePath.size(),
        glslIncludePath.c_str(),
        cookTorranceShader.size(),
        cookTorranceShader.c_str()
    );

    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }
}